

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitLoad(FunctionValidator *this,Load *curr)

{
  Memory *pMVar1;
  Type right;
  Type TVar2;
  
  pMVar1 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->memory).super_IString.str);
  shouldBeTrue<wasm::Load*>(this,pMVar1 != (Memory *)0x0,curr,"memory.load memory must exist");
  if (curr->isAtomic == true) {
    shouldBeTrue<wasm::Load*>
              (this,(bool)((byte)(((this->
                                   super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                   ).
                                   super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                   .
                                   super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .currModule)->features).features & 1),curr,
               "Atomic operations require threads [--enable-threads]");
    shouldBeTrue<wasm::Load*>
              (this,(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type
                    .id - 1 < 3,curr,"Atomic load should be i32 or i64");
  }
  TVar2.id = (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id;
  if (TVar2.id == 6) {
    shouldBeTrue<wasm::Load*>
              (this,SUB41(((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features & 8) >> 3,0),curr,
               "SIMD operations require SIMD [--enable-simd]");
    TVar2.id = (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id;
  }
  validateMemBytes(this,curr->bytes,TVar2,(Expression *)curr);
  validateAlignment(this,(curr->align).addr,
                    (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)12>).
                          super_Expression.type.id,(uint)curr->bytes,curr->isAtomic,
                    (Expression *)curr);
  TVar2.id = (curr->ptr->type).id;
  right = indexType(this,(Name)(curr->memory).super_IString.str);
  shouldBeEqualOrFirstIsUnreachable<wasm::Load*,wasm::Type>
            (this,TVar2,right,curr,"load pointer type must match memory index type");
  if (curr->isAtomic == true) {
    shouldBeFalse<wasm::Load*>(this,curr->signed_,curr,"atomic loads must be unsigned");
    shouldBeIntOrUnreachable
              (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)12>).
                          super_Expression.type.id,(Expression *)curr,
               "atomic loads must be of integers");
    return;
  }
  return;
}

Assistant:

void FunctionValidator::visitLoad(Load* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.load memory must exist");
  if (curr->isAtomic) {
    shouldBeTrue(getModule()->features.hasAtomics(),
                 curr,
                 "Atomic operations require threads [--enable-threads]");
    shouldBeTrue(curr->type == Type::i32 || curr->type == Type::i64 ||
                   curr->type == Type::unreachable,
                 curr,
                 "Atomic load should be i32 or i64");
  }
  if (curr->type == Type::v128) {
    shouldBeTrue(getModule()->features.hasSIMD(),
                 curr,
                 "SIMD operations require SIMD [--enable-simd]");
  }
  validateMemBytes(curr->bytes, curr->type, curr);
  validateAlignment(curr->align, curr->type, curr->bytes, curr->isAtomic, curr);
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    indexType(curr->memory),
    curr,
    "load pointer type must match memory index type");
  if (curr->isAtomic) {
    shouldBeFalse(curr->signed_, curr, "atomic loads must be unsigned");
    shouldBeIntOrUnreachable(
      curr->type, curr, "atomic loads must be of integers");
  }
}